

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::insert(pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
         *__return_storage_ptr__,
        raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        *this,init_type *value)

{
  slot_type *psVar1;
  undefined1 auVar2 [16];
  size_t i;
  undefined8 extraout_RAX;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
  *ppVar3;
  size_t hashval;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(value->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl;
  hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
  i = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
      ::_find_key<std::unique_ptr<int,std::default_delete<int>>>
                ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                  *)this,value,hashval);
  if (i == 0xffffffffffffffff) {
    i = prepare_insert(this,hashval);
    this->slots_[i]._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (value->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (value->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    set_ctrl(this,i,(byte)hashval & 0x7f);
    ppVar3 = (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
              *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
    ppVar3 = (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
              *)0x0;
  }
  psVar1 = this->slots_;
  (__return_storage_ptr__->first).ctrl_ = this->ctrl_ + i;
  (__return_storage_ptr__->first).field_1.slot_ = psVar1 + i;
  __return_storage_ptr__->second = SUB81(ppVar3,0);
  return ppVar3;
}

Assistant:

std::pair<iterator, bool> insert(init_type&& value) {
        return emplace(std::move(value));
    }